

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::Slider::paintEvent(Slider *this,QPaintEvent *param_1)

{
  int xRadius;
  int yRadius;
  SliderPrivate *pSVar1;
  QPalette *pQVar2;
  QColor *pQVar3;
  QColor *lightColor;
  QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
  *this_00;
  QBrush local_88 [8];
  QBrush local_80 [24];
  undefined8 uStack_68;
  QColor grooveColor;
  QPainter local_50 [8];
  QPainter p;
  QRect grh;
  QRect gr;
  QRect sh;
  QPaintEvent *param_1_local;
  Slider *this_local;
  
  this_00 = &this->d;
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(this_00);
  join_0x00000010_0x00000000_ = SliderPrivate::handleRect(pSVar1);
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(this_00);
  join_0x00000010_0x00000000_ = SliderPrivate::grooveRect(pSVar1);
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(this_00);
  _p = SliderPrivate::grooveHighlightedRect(pSVar1,(QRect *)&gr.x2,(QRect *)&grh.x2);
  QPainter::QPainter(local_50,(QPaintDevice *)&this->field_0x10);
  pQVar2 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(pQVar2,Dark);
  uStack_68 = *(undefined8 *)pQVar3;
  grooveColor._0_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
  QPainter::setPen((QColor *)local_50);
  QBrush::QBrush(local_80,(QColor *)&uStack_68,SolidPattern);
  QPainter::setBrush((QBrush *)local_50);
  QBrush::~QBrush(local_80);
  QPainter::drawRect(local_50,(QRect *)&grh.x2);
  QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>::
  operator->(&this->d);
  QPainter::setPen((QColor *)local_50);
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  QBrush::QBrush(local_88,(QColor *)&pSVar1->highlightColor,SolidPattern);
  QPainter::setBrush((QBrush *)local_50);
  QBrush::~QBrush(local_88);
  QPainter::drawRect(local_50,(QRect *)&p);
  QPainter::setRenderHint((RenderHint)local_50,true);
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  xRadius = pSVar1->radius;
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  yRadius = pSVar1->radius;
  pQVar2 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(pQVar2,Shadow);
  pQVar2 = (QPalette *)QWidget::palette();
  lightColor = QPalette::color(pQVar2,Base);
  drawSliderHandle(local_50,(QRect *)&gr.x2,xRadius,yRadius,pQVar3,lightColor);
  QPainter::~QPainter(local_50);
  return;
}

Assistant:

void
Slider::paintEvent( QPaintEvent * )
{
	const QRect sh = d->handleRect();
	const QRect gr = d->grooveRect();
	const QRect grh = d->grooveHighlightedRect( sh, gr );

	QPainter p( this );

	const QColor grooveColor = palette().color( QPalette::Dark );

	p.setPen( grooveColor );
	p.setBrush( grooveColor );

	p.drawRect( gr );

	p.setPen( d->highlightColor );
	p.setBrush( d->highlightColor );

	p.drawRect( grh );

	p.setRenderHint( QPainter::Antialiasing );
	drawSliderHandle( &p, sh, d->radius, d->radius,
		palette().color( QPalette::Shadow ),
		palette().color( QPalette::Base ) );
}